

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

Status * __thiscall
draco::ObjDecoder::DecodeFromFile
          (Status *__return_storage_ptr__,ObjDecoder *this,string *file_name,
          PointCloud *out_point_cloud)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> buffer;
  vector<char,_std::allocator<char>_> local_58;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = ReadFileToBuffer(file_name,&local_58);
  if (bVar1) {
    DecoderBuffer::Init(&this->buffer_,
                        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    this->out_point_cloud_ = out_point_cloud;
    std::__cxx11::string::_M_assign((string *)&this->input_file_name_);
    DecodeInternal(__return_storage_ptr__,this);
  }
  else {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unable to read input file.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_40,local_38 + (long)local_40);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeFromFile(const std::string &file_name,
                                  PointCloud *out_point_cloud) {
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  buffer_.Init(buffer.data(), buffer.size());

  out_point_cloud_ = out_point_cloud;
  input_file_name_ = file_name;
  return DecodeInternal();
}